

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::capsule::capsule(capsule *this,void *value,_func_void_void_ptr *destructor)

{
  int iVar1;
  _func_void_PyObject_ptr *p_Var2;
  long lVar3;
  undefined8 in_RDX;
  char *in_RSI;
  long *in_RDI;
  _lambda__object___1_ local_19;
  undefined8 local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  object::object((object *)0x14f0a2);
  p_Var2 = capsule(void_const*,void(*)(void*))::{lambda(_object*)#1}::
           operator_cast_to_function_pointer(&local_19);
  lVar3 = PyCapsule_New(local_10,0,p_Var2);
  *in_RDI = lVar3;
  if (*in_RDI == 0) {
    pybind11_fail(local_10);
  }
  iVar1 = PyCapsule_SetContext(*in_RDI,local_18);
  if (iVar1 != 0) {
    pybind11_fail(local_10);
  }
  return;
}

Assistant:

capsule(const void *value, void (*destructor)(void *)) {
        m_ptr = PyCapsule_New(const_cast<void *>(value), nullptr, [](PyObject *o) {
            auto destructor = reinterpret_cast<void (*)(void *)>(PyCapsule_GetContext(o));
            void *ptr = PyCapsule_GetPointer(o, nullptr);
            destructor(ptr);
        });

        if (!m_ptr)
            pybind11_fail("Could not allocate capsule object!");

        if (PyCapsule_SetContext(m_ptr, (void *) destructor) != 0)
            pybind11_fail("Could not set capsule context!");
    }